

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O2

void __thiscall
TPZAnalysis::TPZAnalysis
          (TPZAnalysis *this,void **vtt,TPZCompMesh *mesh,bool mustOptimizeBandwidth,ostream *out)

{
  undefined8 *puVar1;
  ESolType EVar2;
  TPZSloanRenumbering *this_00;
  long lVar3;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)*vtt;
  this->fGeoMesh = (TPZGeoMesh *)0x0;
  this->fCompMesh = (TPZCompMesh *)0x0;
  EVar2 = mesh->fSolType;
  this->fSolType = EVar2;
  this->fGraphMesh[0] = (TPZGraphMesh *)0x0;
  this->fGraphMesh[1] = (TPZGraphMesh *)0x0;
  this->fGraphMesh[2] = (TPZGraphMesh *)0x0;
  TPZSolutionMatrix::TPZSolutionMatrix(&this->fSolution,EVar2 == EComplex);
  this->fSolver = (TPZSolver *)0x0;
  lVar3 = 0x180;
  do {
    *(undefined ***)((long)this->fGraphMesh + lVar3 + -0x28) = &PTR__TPZVec_01651130;
    *(undefined8 *)((long)this->fGraphMesh + lVar3 + -0x10) = 0;
    puVar1 = (undefined8 *)((long)this->fGraphMesh + lVar3 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x1e0);
  lVar3 = 0x1e0;
  do {
    *(undefined ***)((long)this->fGraphMesh + lVar3 + -0x28) = &PTR__TPZVec_01651130;
    *(undefined8 *)((long)this->fGraphMesh + lVar3 + -0x10) = 0;
    puVar1 = (undefined8 *)((long)this->fGraphMesh + lVar3 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x240);
  lVar3 = 0x240;
  do {
    *(undefined ***)((long)this->fGraphMesh + lVar3 + -0x28) = &PTR__TPZVec_01651130;
    *(undefined8 *)((long)this->fGraphMesh + lVar3 + -0x10) = 0;
    puVar1 = (undefined8 *)((long)this->fGraphMesh + lVar3 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x2a0);
  this->fStep = 0;
  this->fNthreadsError = 0;
  TPZAutoPointer<TPZStructMatrix>::TPZAutoPointer(&this->fStructMatrix,(TPZStructMatrix *)0x0);
  this_00 = (TPZSloanRenumbering *)operator_new(0xd0);
  TPZSloanRenumbering::TPZSloanRenumbering(this_00);
  TPZAutoPointer<TPZRenumbering>::TPZAutoPointer<TPZSloanRenumbering>(&this->fRenumber,this_00);
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer(&this->fGuiInterface,(TPZGuiInterface *)0x0);
  TTablePostProcess::TTablePostProcess(&this->fTable);
  SetCompMeshInit(this,mesh,mustOptimizeBandwidth);
  return;
}

Assistant:

TPZAnalysis::TPZAnalysis(TPZCompMesh *mesh, bool mustOptimizeBandwidth, std::ostream &out) :
TPZRegisterClassId(&TPZAnalysis::ClassId),
fSolType(mesh->GetSolType()),
// fRhs(fSolType == EComplex ? true : false),
fSolution(fSolType == EComplex ? true : false),
fRenumber(new RENUMBER)
{
  //we must not call virtual methods in constructor
  this->SetCompMeshInit(mesh, mustOptimizeBandwidth);
}